

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::
Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
::operator()(Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
             *this,Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                   *s,
            Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
            *t)

{
  uchar *__first;
  uint8_t *puVar1;
  Node *pNVar2;
  size_t numElements;
  size_t sVar3;
  value_type *args;
  ulong local_30;
  size_t i;
  size_t numElementsWithBuffer;
  Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
  *t_local;
  Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
  *s_local;
  Cloner<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_false>
  *this_local;
  
  numElements = Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                ::calcNumElementsWithBuffer(t,t->mMask + 1);
  __first = s->mInfo;
  puVar1 = s->mInfo;
  sVar3 = Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
          ::calcNumBytesInfo(t,numElements);
  std::copy<unsigned_char*,unsigned_char*>(__first,puVar1 + sVar3,t->mInfo);
  for (local_30 = 0; local_30 < numElements; local_30 = local_30 + 1) {
    if (t->mInfo[local_30] != '\0') {
      pNVar2 = t->mKeyVals;
      args = DataNode<robin_hood::detail::Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>,_true>
             ::operator*(s->mKeyVals + local_30);
      Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
      ::
      DataNode<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>,true>
      ::DataNode<robin_hood::pair<Rml::Character,Rml::FontFaceLayer::TextureBox>&>
                ((DataNode<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>,true>
                  *)(pNVar2 + local_30),t,args);
    }
  }
  return;
}

Assistant:

void operator()(M const& s, M& t) const {
            auto const numElementsWithBuffer = t.calcNumElementsWithBuffer(t.mMask + 1);
            std::copy(s.mInfo, s.mInfo + t.calcNumBytesInfo(numElementsWithBuffer), t.mInfo);

            for (size_t i = 0; i < numElementsWithBuffer; ++i) {
                if (t.mInfo[i]) {
                    ::new (static_cast<void*>(t.mKeyVals + i)) Node(t, *s.mKeyVals[i]);
                }
            }
        }